

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  undefined1 local_1068 [8];
  char buff [4096];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string *local_40;
  bool *local_38;
  
  sVar3 = 0;
  local_40 = inBuffer;
  local_38 = zero;
  do {
    while( true ) {
      sVar1 = read(fd,local_1068,0x1000);
      if (sVar1 < 0) break;
      if (sVar1 == 0) {
        *local_38 = true;
        return sVar3;
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>((string *)local_60,local_1068,local_1068 + sVar1);
      std::__cxx11::string::_M_append((char *)local_40,(ulong)local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      sVar3 = sVar3 + sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 != 0xb) {
    perror("read error");
    sVar3 = -1;
  }
  return sVar3;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero) {
  ssize_t nread = 0;
  ssize_t readSum = 0;
  while (true) {
    char buff[MAX_BUFF];
    if ((nread = read(fd, buff, MAX_BUFF)) < 0) {
      if (errno == EINTR)
        continue;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        perror("read error");
        return -1;
      }
    } else if (nread == 0) {
      // printf("redsum = %d\n", readSum);
      zero = true;
      break;
    }
    // printf("before inBuffer.size() = %d\n", inBuffer.size());
    // printf("nread = %d\n", nread);
    readSum += nread;
    // buff += nread;
    inBuffer += std::string(buff, buff + nread);
    // printf("after inBuffer.size() = %d\n", inBuffer.size());
  }
  return readSum;
}